

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

SBarInfoCommand * __thiscall
SBarInfoCommandFlowControl::NextCommand(SBarInfoCommandFlowControl *this,FScanner *sc)

{
  SBarInfoCommandFlowControl *pSVar1;
  bool bVar2;
  int iVar3;
  undefined **ppuVar4;
  CommandDrawSelectedInventory *this_00;
  
  bVar2 = FScanner::CheckToken(sc,0x101);
  if (!bVar2) {
    FScanner::MustGetToken(sc,0x7d);
    return (SBarInfoCommand *)0x0;
  }
  iVar3 = FScanner::MatchString(sc,SBarInfoCommandNames,8);
  switch(iVar3) {
  case 0:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x80);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    *(undefined2 *)&(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
    _vptr_SBarInfoCommand = (_func_int **)&PTR__SBarInfoCommandFlowControl_007086a0;
    *(undefined8 *)&(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.field_0x34 =
         0xffffffff0000000d;
    (this_00->super_CommandDrawImage).maxwidth = -1;
    (this_00->super_CommandDrawImage).maxheight = -1;
    (this_00->super_CommandDrawImage).spawnScaleX = 1.0;
    (this_00->super_CommandDrawImage).spawnScaleY = 1.0;
    (this_00->super_CommandDrawImage).flags = 0;
    (this_00->super_CommandDrawImage).applyscale = false;
    (this_00->super_CommandDrawImage).offset = LEFT|TOP;
    (this_00->super_CommandDrawImage).texture = (FTexture *)0x0;
    (this_00->super_CommandDrawImage).alpha = 1.0;
    break;
  case 1:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0xa0);
    CommandDrawNumber::CommandDrawNumber
              ((CommandDrawNumber *)this_00,(this->super_SBarInfoCommand).script);
    break;
  case 2:
    this_00 = (CommandDrawSelectedInventory *)operator_new(200);
    CommandDrawSwitchableImage::CommandDrawSwitchableImage
              ((CommandDrawSwitchableImage *)this_00,(this->super_SBarInfoCommand).script);
    break;
  case 3:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x28);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
    _vptr_SBarInfoCommand = (_func_int **)&PTR__CommandDrawMugShot_00708800;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x723dac;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 5;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    break;
  case 4:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x128);
    CommandDrawSelectedInventory::CommandDrawSelectedInventory
              (this_00,(this->super_SBarInfoCommand).script);
    break;
  case 5:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x50);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
    _vptr_SBarInfoCommand = (_func_int **)&PTR__CommandDrawInventoryBar_00708968;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x700000000;
    *(undefined4 *)
     ((long)&(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
             super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most + 3) = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x200000002;
    *(undefined8 *)&(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = 0;
    (this_00->super_CommandDrawImage).image = 0;
    (this_00->super_CommandDrawImage).sprite = 0;
    (this_00->super_CommandDrawImage).spawnScaleX = 2.47032822920623e-323;
    break;
  case 6:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x58);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
    _vptr_SBarInfoCommand = (_func_int **)&PTR__SBarInfoCommand_00708a18;
    *(undefined4 *)
     &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
      super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = 0;
    *(undefined2 *)
     ((long)&(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
             super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array + 4) = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0xffffffff;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0xffffffff;
    *(undefined4 *)
     &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
      super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = 0;
    *(undefined1 *)
     &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
      super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    *(undefined8 *)&(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = 0;
    (this_00->super_CommandDrawImage).maxwidth = 0;
    *(undefined4 *)&(this_00->super_CommandDrawImage).spawnScaleX = 0;
    *(undefined4 *)((long)&(this_00->super_CommandDrawImage).spawnScaleX + 4) = 0;
    *(undefined4 *)&(this_00->super_CommandDrawImage).spawnScaleY = 0;
    *(undefined4 *)((long)&(this_00->super_CommandDrawImage).spawnScaleY + 4) = 0xbff00000;
    break;
  case 7:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x40);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
    _vptr_SBarInfoCommand = (_func_int **)&PTR__SBarInfoCommand_00708a70;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array =
         (SBarInfoCommand **)0xffffffff00000000;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0xffffffff;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x100000000;
    *(undefined8 *)&(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = 0;
    (this_00->super_CommandDrawImage).image = 0;
    (this_00->super_CommandDrawImage).sprite = 0;
    break;
  case 8:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x28);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
    _vptr_SBarInfoCommand = (_func_int **)&PTR__SBarInfoCommand_00708910;
    *(undefined2 *)
     &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
      super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = 0;
    *(undefined8 *)
     ((long)&(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
             super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array + 4) = 0x100000001;
    break;
  case 9:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x60);
    CommandDrawString::CommandDrawString
              ((CommandDrawString *)this_00,(this->super_SBarInfoCommand).script);
    break;
  case 10:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x30);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
    _vptr_SBarInfoCommand = (_func_int **)&PTR__SBarInfoCommand_007089c0;
    *(undefined4 *)
     &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
      super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = 3;
    *(undefined2 *)
     ((long)&(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
             super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array + 4) = 0;
    *(undefined1 *)
     ((long)&(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
             super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array + 6) = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0xffffffff;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0xffffffff;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    break;
  case 0xb:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x38);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = false;
    ppuVar4 = &PTR__SBarInfoCommandFlowControl_00708ac8;
    goto LAB_004bf01e;
  case 0xc:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x48);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = false;
    ppuVar4 = &PTR__CommandPlayerClass_00708d08;
    goto LAB_004bf311;
  case 0xd:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x48);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = false;
    ppuVar4 = &PTR__CommandPlayerType_00708d60;
    goto LAB_004bf311;
  case 0xe:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x38);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = false;
    ppuVar4 = &PTR__SBarInfoCommandFlowControl_00708c50;
LAB_004bf01e:
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
    _vptr_SBarInfoCommand = (_func_int **)ppuVar4;
    *(undefined4 *)&(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.field_0x34 =
         0;
    break;
  case 0xf:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x48);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = false;
    ppuVar4 = &PTR__SBarInfoCommandFlowControl_00708ca8;
LAB_004bf311:
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
    _vptr_SBarInfoCommand = (_func_int **)ppuVar4;
LAB_004bf314:
    (this_00->super_CommandDrawImage).image = 0;
    (this_00->super_CommandDrawImage).sprite = 0;
    (this_00->super_CommandDrawImage).maxwidth = 0;
    (this_00->super_CommandDrawImage).maxheight = 0;
    break;
  case 0x10:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x38);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = false;
    ppuVar4 = &PTR__SBarInfoCommandFlowControl_00708b20;
    goto LAB_004bf498;
  case 0x11:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x38);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = false;
    ppuVar4 = &PTR__SBarInfoCommandFlowControl_00708b98;
    goto LAB_004bf498;
  case 0x12:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x48);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = false;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
    _vptr_SBarInfoCommand = (_func_int **)&PTR__SBarInfoCommandFlowControl_00708db8;
    (this_00->super_CommandDrawImage).image = 0;
    (this_00->super_CommandDrawImage).sprite = 0;
    (this_00->super_CommandDrawImage).maxwidth = 1;
    break;
  case 0x13:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x38);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = false;
    ppuVar4 = &PTR__SBarInfoCommandFlowControl_00708bf8;
    goto LAB_004bf498;
  case 0x14:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x50);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = false;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
    _vptr_SBarInfoCommand = (_func_int **)&PTR__SBarInfoCommandFlowControl_00708e10;
    *(undefined1 *)&(this_00->super_CommandDrawImage).spawnScaleX = 0;
    goto LAB_004bf314;
  case 0x15:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x50);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    *(undefined2 *)&(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
    _vptr_SBarInfoCommand = (_func_int **)&PTR__SBarInfoCommandFlowControl_00708e70;
    (this_00->super_CommandDrawImage).image = 0;
    (this_00->super_CommandDrawImage).sprite = 0;
    (this_00->super_CommandDrawImage).maxwidth = 0;
    (this_00->super_CommandDrawImage).maxheight = 0;
    (this_00->super_CommandDrawImage).spawnScaleX = 0.0;
    break;
  case 0x16:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x58);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).image = 0;
    (this_00->super_CommandDrawImage).sprite = 0x3ff00000;
    (this_00->super_CommandDrawImage).maxwidth = 0;
    (this_00->super_CommandDrawImage).maxheight = 0x3ff00000;
    *(undefined2 *)&(this_00->super_CommandDrawImage).spawnScaleX = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = true;
    ppuVar4 = &PTR__SBarInfoCommandFlowControl_00708ed0;
    goto LAB_004bf498;
  case 0x17:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x40);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = false;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
    _vptr_SBarInfoCommand = (_func_int **)&PTR__SBarInfoCommandFlowControl_00708f28;
    *(undefined1 *)&(this_00->super_CommandDrawImage).image = 0;
    break;
  case 0x18:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x38);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = false;
    ppuVar4 = &PTR__SBarInfoCommandFlowControl_00708f88;
    goto LAB_004bf498;
  case 0x19:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x38);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = false;
    ppuVar4 = &PTR__SBarInfoCommandFlowControl_00708fe8;
LAB_004bf498:
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
    _vptr_SBarInfoCommand = (_func_int **)ppuVar4;
    break;
  case 0x1a:
    this_00 = (CommandDrawSelectedInventory *)operator_new(0x50);
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.script
         = (this->super_SBarInfoCommand).script;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.truth = false;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[1].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    pSVar1 = &(this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    pSVar1->commands[1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array = (SBarInfoCommand **)0x0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Most = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.commands[0].
    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count = 0;
    (this_00->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
    _vptr_SBarInfoCommand = (_func_int **)&PTR__CommandIfCVarInt_00709048;
    *(char **)&(this_00->super_CommandDrawImage).image = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    *(undefined1 *)((long)&(this_00->super_CommandDrawImage).spawnScaleX + 4) = 0;
    break;
  default:
    this_00 = (CommandDrawSelectedInventory *)0x0;
    FScanner::ScriptError(sc,"Unknown command \'%s\'.\n",sc->String);
  }
  return (SBarInfoCommand *)this_00;
}

Assistant:

SBarInfoCommand *SBarInfoCommandFlowControl::NextCommand(FScanner &sc)
{
	if(sc.CheckToken(TK_Identifier))
	{
		switch(sc.MatchString(SBarInfoCommandNames))
		{
			default: break;
			case SBARINFO_DRAWIMAGE: return new CommandDrawImage(script);
			case SBARINFO_DRAWSWITCHABLEIMAGE: return new CommandDrawSwitchableImage(script);
			case SBARINFO_DRAWSTRING: return new CommandDrawString(script);
			case SBARINFO_DRAWNUMBER: return new CommandDrawNumber(script);
			case SBARINFO_DRAWMUGSHOT: return new CommandDrawMugShot(script);
			case SBARINFO_DRAWSELECTEDINVENTORY: return static_cast<SBarInfoCommandFlowControl *> (new CommandDrawSelectedInventory(script));
			case SBARINFO_DRAWSHADER: return new CommandDrawShader(script);
			case SBARINFO_DRAWINVENTORYBAR: return new CommandDrawInventoryBar(script);
			case SBARINFO_DRAWKEYBAR: return new CommandDrawKeyBar(script);
			case SBARINFO_DRAWBAR: return new CommandDrawBar(script);
			case SBARINFO_DRAWGEM: return new CommandDrawGem(script);
			case SBARINFO_GAMEMODE: return new CommandGameMode(script);
			case SBARINFO_USESAMMO: return new CommandUsesAmmo(script);
			case SBARINFO_USESSECONDARYAMMO: return new CommandUsesSecondaryAmmo(script);
			case SBARINFO_INVENTORYBARNOTVISIBLE: return new CommandInventoryBarNotVisible(script);
			case SBARINFO_ASPECTRATIO: return new CommandAspectRatio(script);
			case SBARINFO_ISSELECTED: return new CommandIsSelected(script);
			case SBARINFO_PLAYERCLASS: return new CommandPlayerClass(script);
			case SBARINFO_PLAYERTYPE: return new CommandPlayerType(script);
			case SBARINFO_HASWEAPONPIECE: return new CommandHasWeaponPiece(script);
			case SBARINFO_WEAPONAMMO: return new CommandWeaponAmmo(script);
			case SBARINFO_ININVENTORY: return new CommandInInventory(script);
			case SBARINFO_ALPHA: return new CommandAlpha(script);
			case SBARINFO_IFHEALTH: return new CommandIfHealth(script);
			case SBARINFO_IFINVULNERABLE: return new CommandIfInvulnerable(script);
			case SBARINFO_IFWATERLEVEL: return new CommandIfWaterLevel(script);
			case SBARINFO_IFCVARINT: return new CommandIfCVarInt(script);
		}

		sc.ScriptError("Unknown command '%s'.\n", sc.String);
		return NULL;
	}

	sc.MustGetToken('}');
	return NULL;
}